

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  uchar *puVar4;
  long lVar5;
  ImFont *pIVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uchar *puVar12;
  ulong uVar13;
  uchar *__dest;
  uchar *puVar14;
  uchar *puVar15;
  byte *pbVar16;
  byte *pbVar17;
  uint uVar18;
  undefined7 local_160;
  uint uStack_159;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  ImWchar *pIStack_120;
  float local_118;
  char local_108 [48];
  undefined2 local_d8;
  ImFontConfig local_d0;
  float local_48;
  
  uVar9 = *(uint *)((long)compressed_ttf_data + 8);
  uVar18 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  local_48 = size_pixels;
  puVar4 = (uchar *)ImGui::MemAlloc((ulong)uVar18);
  uVar9 = *compressed_ttf_data;
  if (((uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18) ==
       0x57bc0000) &&
     (uVar9 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar9 >> 0x18 == 0 && (uVar9 & 0xff0000) == 0) && (uVar9 & 0xff00) == 0) &&
     (uVar9 & 0xff) == 0)) {
    uVar9 = *(uint *)((long)compressed_ttf_data + 8);
    uVar13 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18
                    );
    puVar1 = puVar4 + uVar13;
    puVar14 = puVar4 + uVar13 + 1;
    __dest = puVar4;
    pbVar16 = (byte *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = puVar1;
    stb__barrier_out_b = puVar4;
    stb__dout = puVar4;
    do {
      bVar3 = *pbVar16;
      uVar9 = (uint)bVar3;
      if (bVar3 < 0x20) {
        if (bVar3 < 0x18) {
          if (bVar3 < 0x10) {
            if (bVar3 < 8) {
              if (bVar3 == 4) {
                uVar8 = *(ushort *)(pbVar16 + 4) << 8 | *(ushort *)(pbVar16 + 4) >> 8;
                puVar12 = __dest + (ulong)uVar8 + 1;
                if (__dest + (ulong)uVar8 + 1 <= puVar1) {
                  bVar3 = pbVar16[1];
                  bVar7 = pbVar16[2];
                  bVar2 = pbVar16[3];
                  puVar12 = puVar14;
                  if (puVar4 <= __dest + ~((ulong)bVar3 * 0x10000 + (ulong)bVar2 |
                                          (ulong)bVar7 * 0x100)) {
                    iVar10 = uVar8 + 1;
                    do {
                      puVar12 = __dest + 1;
                      *__dest = __dest[~((ulong)bVar2 + (ulong)bVar7 * 0x100) +
                                       (ulong)bVar3 * -0x10000];
                      iVar10 = iVar10 + -1;
                      __dest = puVar12;
                    } while (iVar10 != 0);
                  }
                }
                pbVar17 = pbVar16 + 6;
                stb__dout = puVar12;
              }
              else {
                if (uVar9 != 6) {
                  if (uVar9 == 7) {
                    uVar13 = (ulong)(ushort)(*(ushort *)(pbVar16 + 1) << 8 |
                                            *(ushort *)(pbVar16 + 1) >> 8);
                    puVar15 = __dest + uVar13 + 1;
                    puVar12 = puVar15;
                    if ((puVar15 <= puVar1) &&
                       (puVar12 = puVar14, compressed_ttf_data <= pbVar16 + 3)) {
                      memcpy(__dest,pbVar16 + 3,uVar13 + 1);
                      uVar13 = (ulong)(ushort)(*(ushort *)(pbVar16 + 1) << 8 |
                                              *(ushort *)(pbVar16 + 1) >> 8);
                      puVar12 = puVar15;
                    }
                    lVar5 = 4;
                    stb__dout = puVar12;
                    goto LAB_0012de01;
                  }
                  break;
                }
                puVar12 = __dest + (ulong)pbVar16[4] + 1;
                if (__dest + (ulong)pbVar16[4] + 1 <= puVar1) {
                  bVar3 = pbVar16[1];
                  bVar7 = pbVar16[2];
                  bVar2 = pbVar16[3];
                  puVar12 = puVar14;
                  if (puVar4 <= __dest + ~((ulong)bVar3 * 0x10000 + (ulong)bVar2 |
                                          (ulong)bVar7 * 0x100)) {
                    uVar13 = (ulong)pbVar16[4] + 1;
                    do {
                      puVar12 = __dest + 1;
                      *__dest = __dest[~((ulong)bVar2 + (ulong)bVar7 * 0x100) +
                                       (ulong)bVar3 * -0x10000];
                      uVar9 = (int)uVar13 - 1;
                      uVar13 = (ulong)uVar9;
                      __dest = puVar12;
                    } while (uVar9 != 0);
                  }
                }
                pbVar17 = pbVar16 + 5;
                stb__dout = puVar12;
              }
            }
            else {
              bVar7 = pbVar16[1];
              uVar13 = (ulong)((uVar9 * 0x100 + (uint)bVar7) - 0x7ff);
              puVar12 = __dest + uVar13;
              puVar15 = puVar12;
              if ((puVar12 <= puVar1) && (puVar15 = puVar14, compressed_ttf_data <= pbVar16 + 2)) {
                memcpy(__dest,pbVar16 + 2,uVar13);
                bVar3 = *pbVar16;
                bVar7 = pbVar16[1];
                puVar15 = puVar12;
              }
              uVar13 = (ulong)CONCAT11(bVar3,bVar7);
              lVar5 = -0x7fd;
              stb__dout = puVar15;
LAB_0012de01:
              pbVar17 = pbVar16 + uVar13 + lVar5;
              puVar12 = stb__dout;
              if (pbVar17 == pbVar16) break;
            }
          }
          else {
            uVar8 = *(ushort *)(pbVar16 + 3) << 8 | *(ushort *)(pbVar16 + 3) >> 8;
            puVar12 = __dest + (ulong)uVar8 + 1;
            if ((__dest + (ulong)uVar8 + 1 <= puVar1) &&
               (uVar13 = (ulong)(((uint)pbVar16[1] * 0x100 +
                                 ((uint)pbVar16[2] | (uint)bVar3 << 0x10)) - 0xfffff),
               puVar12 = puVar14, puVar4 <= __dest + -uVar13)) {
              iVar10 = uVar8 + 1;
              do {
                puVar12 = __dest + 1;
                *__dest = __dest[-uVar13];
                iVar10 = iVar10 + -1;
                __dest = puVar12;
              } while (iVar10 != 0);
            }
            pbVar17 = pbVar16 + 5;
            stb__dout = puVar12;
          }
        }
        else {
          puVar12 = __dest + (ulong)pbVar16[3] + 1;
          if ((__dest + (ulong)pbVar16[3] + 1 <= puVar1) &&
             (uVar13 = (ulong)(((uint)pbVar16[1] * 0x100 + ((uint)pbVar16[2] | (uint)bVar3 << 0x10))
                              - 0x17ffff), puVar12 = puVar14, puVar4 <= __dest + -uVar13)) {
            uVar11 = (ulong)pbVar16[3] + 1;
            do {
              puVar12 = __dest + 1;
              *__dest = __dest[-uVar13];
              uVar9 = (int)uVar11 - 1;
              uVar11 = (ulong)uVar9;
              __dest = puVar12;
            } while (uVar9 != 0);
          }
          pbVar17 = pbVar16 + 4;
          stb__dout = puVar12;
        }
      }
      else if ((char)bVar3 < '\0') {
        uVar9 = uVar9 - 0x7f;
        uVar13 = (ulong)uVar9;
        puVar12 = __dest + uVar13;
        puVar15 = puVar12;
        if ((puVar12 <= puVar1) &&
           (bVar3 = pbVar16[1], puVar12 = puVar14, puVar15 = puVar14,
           puVar4 <= __dest + ~(ulong)bVar3)) {
          while (puVar12 = __dest, puVar15 = stb__dout, uVar9 != 0) {
            stb__dout = __dest + 1;
            *__dest = __dest[~(ulong)bVar3];
            uVar9 = (int)uVar13 - 1;
            uVar13 = (ulong)uVar9;
            __dest = stb__dout;
          }
        }
        stb__dout = puVar15;
        pbVar17 = pbVar16 + 2;
      }
      else {
        if (bVar3 < 0x40) {
          puVar12 = __dest + (uVar9 - 0x1f);
          puVar15 = puVar12;
          if ((puVar12 <= puVar1) && (puVar15 = puVar14, compressed_ttf_data <= pbVar16 + 1)) {
            memcpy(__dest,pbVar16 + 1,(ulong)(uVar9 - 0x1f));
            bVar3 = *pbVar16;
            puVar15 = puVar12;
          }
          uVar13 = (ulong)bVar3;
          lVar5 = -0x1e;
          stb__dout = puVar15;
          goto LAB_0012de01;
        }
        puVar12 = __dest + (ulong)pbVar16[2] + 1;
        if ((__dest + (ulong)pbVar16[2] + 1 <= puVar1) &&
           (uVar13 = (ulong)(((uint)bVar3 * 0x100 + (uint)pbVar16[1]) - 0x3fff), puVar12 = puVar14,
           puVar4 <= __dest + -uVar13)) {
          uVar11 = (ulong)pbVar16[2] + 1;
          do {
            puVar12 = __dest + 1;
            *__dest = __dest[-uVar13];
            uVar9 = (int)uVar11 - 1;
            uVar11 = (ulong)uVar9;
            __dest = puVar12;
          } while (uVar9 != 0);
        }
        pbVar17 = pbVar16 + 3;
        stb__dout = puVar12;
      }
      __dest = puVar12;
      pbVar16 = pbVar17;
    } while (puVar12 <= puVar1);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_d0.MergeMode = false;
    local_d0._73_3_ = 0;
    local_d0.FontBuilderFlags = 0;
    local_160._0_3_ = 0;
    local_160._3_4_ = 0;
    uStack_159 = 0;
    local_138._0_1_ = false;
    local_138._1_3_ = 0;
    local_138._4_4_ = 0.0;
    uStack_130._0_4_ = 0.0;
    uStack_130._4_4_ = 0.0;
    local_128._0_4_ = 0.0;
    local_128._4_4_ = 0;
    pIStack_120 = (ImWchar *)0x0;
    local_118 = 0.0;
    local_108[0] = '\0';
    local_108[1] = '\0';
    local_108[2] = '\0';
    local_108[3] = '\0';
    local_108[4] = '\0';
    local_108[5] = '\0';
    local_108[6] = '\0';
    local_108[7] = '\0';
    local_108[8] = '\0';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    local_108[0x10] = '\0';
    local_108[0x11] = '\0';
    local_108[0x12] = '\0';
    local_108[0x13] = '\0';
    local_108[0x14] = '\0';
    local_108[0x15] = '\0';
    local_108[0x16] = '\0';
    local_108[0x17] = '\0';
    local_108[0x18] = '\0';
    local_108[0x19] = '\0';
    local_108[0x1a] = '\0';
    local_108[0x1b] = '\0';
    local_108[0x1c] = '\0';
    local_108[0x1d] = '\0';
    local_108[0x1e] = '\0';
    local_108[0x1f] = '\0';
    local_108[0x20] = '\0';
    local_108[0x21] = '\0';
    local_108[0x22] = '\0';
    local_108[0x23] = '\0';
    local_108[0x24] = '\0';
    local_108[0x25] = '\0';
    local_108[0x26] = '\0';
    local_108[0x27] = '\0';
    local_108._40_8_ = 0;
    local_d8 = 0;
    local_d0.OversampleH = 3;
    local_d0.OversampleV = 1;
    local_d0.EllipsisChar = 0xffff;
    local_d0.RasterizerMultiply = 1.0;
    local_d0.GlyphMaxAdvanceX = 3.4028235e+38;
  }
  else {
    local_160 = (undefined7)*(undefined8 *)&font_cfg_template->field_0xd;
    uStack_159._1_3_ = (undefined3)((uint)font_cfg_template->SizePixels >> 8);
    uStack_159._0_1_ = (undefined1)((ulong)*(undefined8 *)&font_cfg_template->field_0xd >> 0x38);
    local_d0.OversampleH = font_cfg_template->OversampleH;
    local_d0.OversampleV = font_cfg_template->OversampleV;
    local_138._0_1_ = font_cfg_template->PixelSnapH;
    local_138._1_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    local_138._4_4_ = (font_cfg_template->GlyphExtraSpacing).x;
    uStack_130 = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    local_128 = *(undefined8 *)&(font_cfg_template->GlyphOffset).y;
    pIStack_120 = font_cfg_template->GlyphRanges;
    local_118 = font_cfg_template->GlyphMinAdvanceX;
    local_d0.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    local_d0.MergeMode = font_cfg_template->MergeMode;
    local_d0._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    local_d0.FontBuilderFlags = font_cfg_template->FontBuilderFlags;
    local_d0.RasterizerMultiply = font_cfg_template->RasterizerMultiply;
    local_d0.EllipsisChar = font_cfg_template->EllipsisChar;
    local_d8 = *(undefined2 *)((long)&font_cfg_template->DstFont + 6);
    local_108._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_108._40_8_ = *(undefined8 *)&font_cfg_template->field_0x7e;
    local_108._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_108._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_108._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_108._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
  }
  local_d0.FontDataOwnedByAtlas = true;
  local_d0._13_3_ = (undefined3)local_160;
  local_d0.FontNo = local_160._3_4_;
  local_d0.PixelSnapH = local_138._0_1_;
  local_d0._33_3_ = local_138._1_3_;
  local_d0.GlyphExtraSpacing.x = local_138._4_4_;
  local_d0.GlyphExtraSpacing.y = (float)uStack_130;
  local_d0.GlyphOffset.x = uStack_130._4_4_;
  local_d0.GlyphOffset.y = (float)local_128;
  local_d0._52_4_ = local_128._4_4_;
  local_d0.GlyphRanges = pIStack_120;
  local_d0.GlyphMinAdvanceX = local_118;
  local_d0.Name[0] = local_108[0];
  local_d0.Name[1] = local_108[1];
  local_d0.Name[2] = local_108[2];
  local_d0.Name[3] = local_108[3];
  local_d0.Name[4] = local_108[4];
  local_d0.Name[5] = local_108[5];
  local_d0.Name[6] = local_108[6];
  local_d0.Name[7] = local_108[7];
  local_d0.Name[8] = local_108[8];
  local_d0.Name[9] = local_108[9];
  local_d0.Name[10] = local_108[10];
  local_d0.Name[0xb] = local_108[0xb];
  local_d0.Name[0xc] = local_108[0xc];
  local_d0.Name[0xd] = local_108[0xd];
  local_d0.Name[0xe] = local_108[0xe];
  local_d0.Name[0xf] = local_108[0xf];
  local_d0.Name[0x10] = local_108[0x10];
  local_d0.Name[0x11] = local_108[0x11];
  local_d0.Name[0x12] = local_108[0x12];
  local_d0.Name[0x13] = local_108[0x13];
  local_d0.Name[0x14] = local_108[0x14];
  local_d0.Name[0x15] = local_108[0x15];
  local_d0.Name[0x16] = local_108[0x16];
  local_d0.Name[0x17] = local_108[0x17];
  local_d0.Name[0x18] = local_108[0x18];
  local_d0.Name[0x19] = local_108[0x19];
  local_d0.Name[0x1a] = local_108[0x1a];
  local_d0.Name[0x1b] = local_108[0x1b];
  local_d0.Name[0x1c] = local_108[0x1c];
  local_d0.Name[0x1d] = local_108[0x1d];
  local_d0.Name[0x1e] = local_108[0x1e];
  local_d0.Name[0x1f] = local_108[0x1f];
  local_d0.Name[0x20] = local_108[0x20];
  local_d0.Name[0x21] = local_108[0x21];
  local_d0.Name[0x22] = local_108[0x22];
  local_d0.Name[0x23] = local_108[0x23];
  local_d0.Name[0x24] = local_108[0x24];
  local_d0.Name[0x25] = local_108[0x25];
  local_d0.Name[0x26] = local_108[0x26];
  local_d0.Name[0x27] = local_108[0x27];
  local_d0._126_8_ = local_108._40_8_;
  local_d0.DstFont._6_2_ = local_d8;
  local_d0.SizePixels =
       (float)(~-(uint)(0.0 < local_48) & uStack_159 | (uint)local_48 & -(uint)(0.0 < local_48));
  if (glyph_ranges != (ImWchar *)0x0) {
    local_d0.GlyphRanges = glyph_ranges;
  }
  local_d0.FontData = puVar4;
  local_d0.FontDataSize = uVar18;
  pIVar6 = AddFont(this,&local_d0);
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}